

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTableGet(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name table)

{
  Name table_00;
  Name name;
  Table *pTVar1;
  TableGet *pTVar2;
  Ok local_e9;
  uintptr_t local_e8;
  IRBuilder *local_e0;
  size_t local_d8;
  IRBuilder *local_d0;
  size_t local_c8;
  uintptr_t local_c0;
  Type type;
  Err local_b0;
  Err *local_80;
  Err *err;
  Result<wasm::Ok> _val;
  TableGet curr;
  IRBuilder *this_local;
  Name table_local;
  
  table_local.super_IString.str._M_len = table.super_IString.str._M_str;
  this_local = table.super_IString.str._M_len;
  pTVar2 = (TableGet *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  curr.index = (Expression *)this;
  table_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  TableGet::TableGet(pTVar2);
  wasm::Name::operator=
            ((Name *)&curr.super_SpecificExpression<(wasm::Expression::Id)45>.super_Expression.type,
             (Name *)&this_local);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitTableGet
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pTVar2);
  local_80 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  type.id._4_1_ = local_80 != (Err *)0x0;
  if (type.id._4_1_) {
    wasm::Err::Err(&local_b0,local_80);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  type.id._5_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (type.id._4_4_ == 0) {
    local_d0 = this_local;
    local_c8 = table_local.super_IString.str._M_len;
    name.super_IString.str._M_str = (char *)table_local.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)this_local;
    pTVar1 = Module::getTable(this->wasm,name);
    local_e8 = (pTVar1->type).id;
    local_e0 = this_local;
    local_d8 = table_local.super_IString.str._M_len;
    table_00.super_IString.str._M_str = (char *)table_local.super_IString.str._M_len;
    table_00.super_IString.str._M_len = (size_t)this_local;
    local_c0 = local_e8;
    pTVar2 = Builder::makeTableGet
                       (&this->builder,table_00,(Expression *)curr.table.super_IString.str._M_str,
                        (Type)local_e8);
    push(this,(Expression *)pTVar2);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_e9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTableGet(Name table) {
  TableGet curr;
  curr.table = table;
  CHECK_ERR(visitTableGet(&curr));
  auto type = wasm.getTable(table)->type;
  push(builder.makeTableGet(table, curr.index, type));
  return Ok{};
}